

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1188:13)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1188:13)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Maybe<int>_> depResult;
  Maybe<int> local_358;
  NullableValue<kj::Exception> local_350;
  char local_1b8;
  char local_1b4;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 local_1b0;
  ExceptionOr<kj::_::Void> local_1a8;
  
  local_350.isSet = false;
  local_1b8 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_350);
  if (local_350.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1a8,&local_350.field_1.value);
    local_1a8.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a8);
  }
  else {
    if (local_1b8 != '\x01') goto LAB_001db077;
    local_358.ptr.isSet = (bool)local_1b4;
    if (local_1b4 == '\x01') {
      local_358.ptr.field_1 = local_1b0;
      local_1b4 = '\0';
    }
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)this,&local_358);
    local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1a8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1a8);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
LAB_001db077:
  NullableValue<kj::Exception>::~NullableValue(&local_350);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }